

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

StringEntry * __thiscall
cmELFInternalImpl<cmELFTypes32>::GetDynamicSectionString
          (cmELFInternalImpl<cmELFTypes32> *this,uint tag)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  uint uVar3;
  istream *piVar4;
  cmELF *pcVar5;
  uint uVar6;
  long *plVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  ELF_Dyn *dyn;
  pointer paVar10;
  ulong uVar11;
  byte bVar12;
  long lVar13;
  _Base_ptr p_Var14;
  ulong uVar15;
  bool bVar16;
  char c;
  char local_55;
  uint local_4c;
  mapped_type *local_48;
  long local_40;
  ulong local_38;
  
  p_Var1 = &(this->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header;
  p_Var14 = (this->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header.
            _M_header._M_parent;
  p_Var9 = &p_Var1->_M_header;
  for (; p_Var14 != (_Base_ptr)0x0; p_Var14 = (&p_Var14->_M_left)[bVar16]) {
    bVar16 = p_Var14[1]._M_color < tag;
    if (!bVar16) {
      p_Var9 = p_Var14;
    }
  }
  p_Var14 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var9 != p_Var1) && (p_Var14 = p_Var9, tag < p_Var9[1]._M_color)) {
    p_Var14 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var14 != p_Var1) {
    if (p_Var14[2]._M_parent != (_Base_ptr)0x0) {
      return (StringEntry *)&p_Var14[1]._M_parent;
    }
    return (mapped_type *)0x0;
  }
  local_4c = tag;
  local_48 = std::
             map<unsigned_int,_cmELF::StringEntry,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cmELF::StringEntry>_>_>
             ::operator[](&(this->super_cmELFInternal).DynamicSectionStrings,&local_4c);
  local_48->Position = 0;
  local_48->Size = 0;
  local_48->IndexInSection = -1;
  bVar16 = LoadDynamicSection(this);
  if (bVar16) {
    pmVar8 = (mapped_type *)
             (this->SectionHeaders).super__Vector_base<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar15 = (ulong)*(uint *)((long)&pmVar8->Value +
                             (long)(this->super_cmELFInternal).DynamicSectionIndex * 0x28 + 0x18);
    uVar11 = ((long)(this->SectionHeaders).
                    super__Vector_base<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pmVar8 >> 3) * -0x3333333333333333;
    if (uVar11 < uVar15 || uVar11 - uVar15 == 0) {
      pcVar5 = (this->super_cmELFInternal).External;
      std::__cxx11::string::_M_replace
                ((ulong)&pcVar5->ErrorMessage,0,(char *)(pcVar5->ErrorMessage)._M_string_length,
                 0x520da6);
      (this->super_cmELFInternal).ELFType = FileTypeInvalid;
      return (mapped_type *)0x0;
    }
    paVar10 = (this->DynamicSectionEntries).
              super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (paVar10 !=
        (this->DynamicSectionEntries).super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      lVar13 = (long)&pmVar8->Value + uVar15 * 0x28;
      local_40 = lVar13;
      do {
        uVar6 = local_4c;
        uVar2 = paVar10->d_tag;
        if (uVar2 == local_4c) {
          uVar15 = (ulong)(paVar10->d_un).d_val;
          uVar3 = *(uint *)(lVar13 + 0x14);
          if ((paVar10->d_un).d_val < uVar3) {
            bVar12 = 0;
            std::istream::seekg((this->super_cmELFInternal).Stream,*(uint *)(lVar13 + 0x10) + uVar15
                                ,0);
            local_38 = uVar15;
            do {
              plVar7 = (long *)std::istream::get((char *)(this->super_cmELFInternal).Stream);
              uVar11 = uVar15;
              if (((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) ||
                 ((bool)(bVar12 & local_55 != '\0'))) break;
              if (local_55 == '\0') {
                bVar12 = 1;
              }
              else {
                std::__cxx11::string::push_back((char)local_48);
              }
              uVar15 = uVar15 + 1;
              uVar11 = (ulong)uVar3;
            } while (uVar3 != uVar15);
            lVar13 = local_40;
            piVar4 = (this->super_cmELFInternal).Stream;
            if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
              local_48->Position = *(uint *)(local_40 + 0x10) + local_38;
              local_48->Size = uVar11 - local_38;
              local_48->IndexInSection =
                   (int)((ulong)((long)paVar10 -
                                (long)(this->DynamicSectionEntries).
                                      super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3);
              pmVar8 = local_48;
            }
            else {
              pcVar5 = (this->super_cmELFInternal).External;
              std::__cxx11::string::_M_replace
                        ((ulong)&pcVar5->ErrorMessage,0,
                         (char *)(pcVar5->ErrorMessage)._M_string_length,0x520e1e);
              (this->super_cmELFInternal).ELFType = FileTypeInvalid;
              std::__cxx11::string::_M_replace
                        ((ulong)local_48,0,(char *)(local_48->Value)._M_string_length,0x550243);
              pmVar8 = (mapped_type *)0x0;
            }
          }
          else {
            pcVar5 = (this->super_cmELFInternal).External;
            std::__cxx11::string::_M_replace
                      ((ulong)&pcVar5->ErrorMessage,0,
                       (char *)(pcVar5->ErrorMessage)._M_string_length,0x520dd6);
            (this->super_cmELFInternal).ELFType = FileTypeInvalid;
            pmVar8 = (mapped_type *)0x0;
          }
        }
        if (uVar2 == uVar6) {
          return pmVar8;
        }
        paVar10 = paVar10 + 1;
        if (paVar10 ==
            (this->DynamicSectionEntries).super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          return (mapped_type *)0x0;
        }
      } while( true );
    }
  }
  return (mapped_type *)0x0;
}

Assistant:

cmELF::StringEntry const*
cmELFInternalImpl<Types>::GetDynamicSectionString(unsigned int tag)
{
  // Short-circuit if already checked.
  std::map<unsigned int, StringEntry>::iterator dssi =
    this->DynamicSectionStrings.find(tag);
  if(dssi != this->DynamicSectionStrings.end())
    {
    if(dssi->second.Position > 0)
      {
      return &dssi->second;
      }
    return 0;
    }

  // Create an entry for this tag.  Assume it is missing until found.
  StringEntry& se = this->DynamicSectionStrings[tag];
  se.Position = 0;
  se.Size = 0;
  se.IndexInSection = -1;

  // Try reading the dynamic section.
  if(!this->LoadDynamicSection())
    {
    return 0;
    }

  // Get the string table referenced by the DYNAMIC section.
  ELF_Shdr const& sec = this->SectionHeaders[this->DynamicSectionIndex];
  if(sec.sh_link >= this->SectionHeaders.size())
    {
    this->SetErrorMessage("Section DYNAMIC has invalid string table index.");
    return 0;
    }
  ELF_Shdr const& strtab = this->SectionHeaders[sec.sh_link];

  // Look for the requested entry.
  for(typename std::vector<ELF_Dyn>::iterator
        di = this->DynamicSectionEntries.begin();
      di != this->DynamicSectionEntries.end(); ++di)
    {
    ELF_Dyn& dyn = *di;
    if(static_cast<tagtype>(dyn.d_tag) == static_cast<tagtype>(tag))
      {
      // We found the tag requested.
      // Make sure the position given is within the string section.
      if(dyn.d_un.d_val >= strtab.sh_size)
        {
        this->SetErrorMessage("Section DYNAMIC references string beyond "
                              "the end of its string section.");
        return 0;
        }

      // Seek to the position reported by the entry.
      unsigned long first = static_cast<unsigned long>(dyn.d_un.d_val);
      unsigned long last = first;
      unsigned long end = static_cast<unsigned long>(strtab.sh_size);
      this->Stream.seekg(strtab.sh_offset + first);

      // Read the string.  It may be followed by more than one NULL
      // terminator.  Count the total size of the region allocated to
      // the string.  This assumes that the next string in the table
      // is non-empty, but the "chrpath" tool makes the same
      // assumption.
      bool terminated = false;
      char c;
      while(last != end && this->Stream.get(c) && !(terminated && c))
        {
        ++last;
        if(c)
          {
          se.Value += c;
          }
        else
          {
          terminated = true;
          }
        }

      // Make sure the whole value was read.
      if(!this->Stream)
        {
        this->SetErrorMessage("Dynamic section specifies unreadable RPATH.");
        se.Value = "";
        return 0;
        }

      // The value has been read successfully.  Report it.
      se.Position = static_cast<unsigned long>(strtab.sh_offset + first);
      se.Size = last - first;
      se.IndexInSection =
        static_cast<int>(di - this->DynamicSectionEntries.begin());
      return &se;
      }
    }
  return 0;
}